

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperGraph.h
# Opt level: O0

void __thiscall HyperGraph::build_n_RRsets(HyperGraph *this,size_t numSamples)

{
  uint uVar1;
  long lVar2;
  size_t local_58;
  ulong local_48;
  size_t i;
  size_t prevSize;
  size_t numSamples_local;
  HyperGraph *this_local;
  uint64_t *psfmt64;
  uint32_t r;
  
  local_48 = this->__numRRsets;
  local_58 = numSamples;
  if (numSamples < this->__numRRsets) {
    local_58 = this->__numRRsets;
  }
  this->__numRRsets = local_58;
  for (; local_48 < numSamples; local_48 = local_48 + 1) {
    uVar1 = this->__numV;
    if (0x17d < dsfmt_global_data.idx) {
      dsfmt_gen_rand_all(&dsfmt_global_data);
      dsfmt_global_data.idx = 0;
    }
    lVar2 = (long)dsfmt_global_data.idx;
    dsfmt_global_data.idx = dsfmt_global_data.idx + 1;
    build_one_RRset(this,(uint)dsfmt_global_data.status[0].u[lVar2] % uVar1,local_48);
  }
  return;
}

Assistant:

void build_n_RRsets(const size_t numSamples)
    {
        if (numSamples > SIZE_MAX)
        {
            std::cout << "Error:R too large" << std::endl;
            exit(1);
        }
        const auto prevSize = __numRRsets;
        __numRRsets = __numRRsets > numSamples ? __numRRsets : numSamples;
        for (auto i = prevSize; i < numSamples; i++)
        {
            build_one_RRset(dsfmt_gv_genrand_uint32_range(__numV), i);
        }
    }